

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O3

int __thiscall geemuboi::core::CPU::sbc_a_b(CPU *this)

{
  uint8_t *puVar1;
  byte bVar2;
  Registers *pRVar3;
  int iVar4;
  uint8_t uVar5;
  byte bVar6;
  int iVar7;
  uint uVar8;
  
  pRVar3 = this->regs;
  uVar8 = pRVar3->f >> 4 & 1;
  pRVar3->f = '@';
  bVar2 = pRVar3->a;
  iVar7 = (pRVar3->b & 0xf) - uVar8;
  iVar4 = pRVar3->b - uVar8;
  if (((int)(bVar2 & 0xf) < iVar7) || ((int)(uint)bVar2 < iVar4)) {
    bVar6 = 0x60;
    if ((int)(uint)bVar2 < iVar4) {
      bVar6 = ((int)(bVar2 & 0xf) < iVar7) << 5 | 0x50;
    }
    pRVar3->f = bVar6;
  }
  uVar5 = bVar2 - (char)iVar4;
  pRVar3->a = uVar5;
  if (uVar5 == '\0') {
    puVar1 = &this->regs->f;
    *puVar1 = *puVar1 | 0x80;
  }
  return 1;
}

Assistant:

int CPU::sbc_a_b() {
    sbc_r8_r8(regs.a, regs.b);
    return 1;
}